

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O3

int b_array::detach_item<int>(Array<int> *data,size_t *size)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  
  if (*size != 0) {
    piVar3 = Array<int>::operator[](data,*size - 1);
    iVar1 = *piVar3;
    piVar3 = Array<int>::operator[](data,*size);
    *piVar3 = 0;
    sVar2 = *size;
    *size = sVar2 - 1;
    piVar3 = Array<int>::operator[](data,sVar2 - 1);
    *piVar3 = 0;
    return iVar1;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jaasonw[P]Database/include/util/array/array_util.h"
                ,0x4c,"T b_array::detach_item(b_array::Array<T> &, size_t &) [T = int]");
}

Assistant:

T detach_item(b_array::Array<T>& data, size_t& size) {
    assert(size > 0);
    T item = data[size - 1];
    data[size] = T();
    data[--size] = T();
    return item;
}